

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O3

SASL_OUTCOME_HANDLE sasl_outcome_create(sasl_code code_value)

{
  int iVar1;
  SASL_OUTCOME_HANDLE __ptr;
  AMQP_VALUE value;
  AMQP_VALUE item_value;
  SASL_OUTCOME_INSTANCE *sasl_outcome_instance;
  
  __ptr = (SASL_OUTCOME_HANDLE)malloc(8);
  if (__ptr != (SASL_OUTCOME_HANDLE)0x0) {
    value = amqpvalue_create_composite_with_ulong_descriptor(0x44);
    __ptr->composite_value = value;
    if (value != (AMQP_VALUE)0x0) {
      item_value = amqpvalue_create_ubyte(code_value);
      iVar1 = amqpvalue_set_composite_item(value,0,item_value);
      amqpvalue_destroy(item_value);
      if (iVar1 == 0) {
        return __ptr;
      }
      amqpvalue_destroy(value);
    }
    free(__ptr);
  }
  return (SASL_OUTCOME_HANDLE)0x0;
}

Assistant:

SASL_OUTCOME_HANDLE sasl_outcome_create(sasl_code code_value)
{
    SASL_OUTCOME_INSTANCE* sasl_outcome_instance = (SASL_OUTCOME_INSTANCE*)malloc(sizeof(SASL_OUTCOME_INSTANCE));
    if (sasl_outcome_instance != NULL)
    {
        sasl_outcome_instance->composite_value = amqpvalue_create_composite_with_ulong_descriptor(68);
        if (sasl_outcome_instance->composite_value == NULL)
        {
            free(sasl_outcome_instance);
            sasl_outcome_instance = NULL;
        }
        else
        {
            AMQP_VALUE code_amqp_value;
            int result = 0;

            code_amqp_value = amqpvalue_create_sasl_code(code_value);
            if ((result == 0) && (amqpvalue_set_composite_item(sasl_outcome_instance->composite_value, 0, code_amqp_value) != 0))
            {
                result = MU_FAILURE;
            }

            amqpvalue_destroy(code_amqp_value);
            if (result != 0)
            {
                sasl_outcome_destroy(sasl_outcome_instance);
                sasl_outcome_instance = NULL;
            }
        }
    }

    return sasl_outcome_instance;
}